

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_sampled_image_op
          (CompilerHLSL *this,uint32_t result_type,uint32_t result_id,uint32_t image_id,
          uint32_t samp_id)

{
  uint32_t result_id_00;
  uint32_t result_type_00;
  bool bVar1;
  TypedID<(spirv_cross::Types)2> local_48;
  VariableID local_44;
  undefined1 local_40 [40];
  uint32_t samp_id_local;
  uint32_t image_id_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerHLSL *this_local;
  
  local_40._32_4_ = samp_id;
  local_40._36_4_ = image_id;
  samp_id_local = result_id;
  image_id_local = result_type;
  _result_id_local = this;
  if (((this->hlsl_options).shader_model < 0x28) ||
     (bVar1 = VectorView<spirv_cross::CombinedImageSampler>::empty
                        (&(this->super_CompilerGLSL).super_Compiler.combined_image_samplers.
                          super_VectorView<spirv_cross::CombinedImageSampler>), !bVar1)) {
    result_type_00 = image_id_local;
    result_id_00 = samp_id_local;
    TypedID<(spirv_cross::Types)2>::TypedID(&local_44,local_40._36_4_);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_48,local_40._32_4_);
    CompilerGLSL::to_combined_image_sampler_abi_cxx11_
              ((CompilerGLSL *)local_40,(VariableID)(uint32_t)this,local_44);
    CompilerGLSL::emit_op
              (&this->super_CompilerGLSL,result_type_00,result_id_00,(string *)local_40,true,true);
    ::std::__cxx11::string::~string((string *)local_40);
  }
  else {
    Compiler::set<spirv_cross::SPIRCombinedImageSampler,unsigned_int&,unsigned_int&,unsigned_int&>
              ((Compiler *)this,samp_id_local,&image_id_local,(uint *)(local_40 + 0x24),
               (uint *)(local_40 + 0x20));
  }
  return;
}

Assistant:

void CompilerHLSL::emit_sampled_image_op(uint32_t result_type, uint32_t result_id, uint32_t image_id, uint32_t samp_id)
{
	if (hlsl_options.shader_model >= 40 && combined_image_samplers.empty())
	{
		set<SPIRCombinedImageSampler>(result_id, result_type, image_id, samp_id);
	}
	else
	{
		// Make sure to suppress usage tracking. It is illegal to create temporaries of opaque types.
		emit_op(result_type, result_id, to_combined_image_sampler(image_id, samp_id), true, true);
	}
}